

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int resolve_hash_table_find_equal(void *val1_p,void *val2_p,int mod,void *UNUSED_cb_data)

{
  lys_node *node;
  long lVar1;
  long *plVar2;
  char *pcVar3;
  int iVar4;
  lys_module *plVar5;
  lys_module *plVar6;
  uint local_64;
  int i;
  char *str;
  parsed_pred pp;
  lyd_node *elem2;
  lyd_node *val2;
  void *UNUSED_cb_data_local;
  int mod_local;
  void *val2_p_local;
  void *val1_p_local;
  
  if (mod != 0) {
    __assert_fail("!mod",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x485,"int resolve_hash_table_find_equal(void *, void *, int, void *)");
  }
  node = *val1_p;
  lVar1 = *(long *)((long)val1_p + 0x10);
  plVar2 = *val2_p;
  if ((lys_node *)*plVar2 != node) {
    return 0;
  }
  iVar4 = *(int *)(*plVar2 + 0x38);
  if ((iVar4 != 1) && (iVar4 != 4)) {
    if (iVar4 == 8) {
      pcVar3 = (char *)plVar2[7];
      iVar4 = strncmp(pcVar3,*(char **)(lVar1 + 0x20),(long)*(int *)(lVar1 + 0x28));
      if ((iVar4 == 0) && (pcVar3[*(int *)(lVar1 + 0x28)] == '\0')) {
        return 1;
      }
      return 0;
    }
    if (iVar4 == 0x10) {
      if (*(char *)(*plVar2 + 0x1e) == '\0') {
        __assert_fail("((struct lys_node_list *)val2->schema)->keys_size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                      ,0x49c,"int resolve_hash_table_find_equal(void *, void *, int, void *)");
      }
      pp.schema._0_4_ = (uint)*(undefined8 *)((long)val1_p + 8);
      if (*(byte *)(*plVar2 + 0x1e) != (uint)pp.schema) {
        __assert_fail("((struct lys_node_list *)val2->schema)->keys_size == pp.len",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                      ,0x49d,"int resolve_hash_table_find_equal(void *, void *, int, void *)");
      }
      pp.pred = (anon_struct_48_6_89480d8a *)plVar2[8];
      local_64 = 0;
      for (; pp.pred != (anon_struct_48_6_89480d8a *)0x0 && (int)local_64 < (int)(uint)pp.schema;
          pp.pred = *(anon_struct_48_6_89480d8a **)&(pp.pred)->nam_len) {
        if (*(long *)(lVar1 + (long)(int)local_64 * 0x30) == 0) {
          plVar5 = lyd_node_module((lyd_node *)pp.pred);
          plVar6 = lys_node_module(node);
          if (plVar5 != plVar6) break;
        }
        else {
          plVar5 = lyd_node_module((lyd_node *)pp.pred);
          iVar4 = strncmp(plVar5->name,*(char **)(lVar1 + (long)(int)local_64 * 0x30),
                          (long)*(int *)(lVar1 + (long)(int)local_64 * 0x30 + 8));
          if ((iVar4 != 0) ||
             (plVar5 = lyd_node_module((lyd_node *)pp.pred),
             plVar5->name[*(int *)(lVar1 + (long)(int)local_64 * 0x30 + 8)] != '\0')) break;
        }
        iVar4 = strncmp(*(char **)(pp.pred)->mod_name,
                        *(char **)(lVar1 + (long)(int)local_64 * 0x30 + 0x10),
                        (long)*(int *)(lVar1 + (long)(int)local_64 * 0x30 + 0x18));
        if ((iVar4 != 0) ||
           (*(char *)(*(long *)(pp.pred)->mod_name +
                     (long)*(int *)(lVar1 + (long)(int)local_64 * 0x30 + 0x18)) != '\0')) break;
        pcVar3 = *(char **)&pp.pred[1].mod_name_len;
        iVar4 = strncmp(pcVar3,*(char **)(lVar1 + (long)(int)local_64 * 0x30 + 0x20),
                        (long)*(int *)(lVar1 + (long)(int)local_64 * 0x30 + 0x28));
        if ((iVar4 != 0) || (pcVar3[*(int *)(lVar1 + (long)(int)local_64 * 0x30 + 0x28)] != '\0'))
        break;
        local_64 = local_64 + 1;
      }
      if (local_64 == (uint)pp.schema) {
        return 1;
      }
      return 0;
    }
    if ((iVar4 != 0x20) && (iVar4 != 0x8020)) {
      ly_log((ly_ctx *)**(undefined8 **)(*plVar2 + 0x30),LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
             ,0x4c5);
      return 0;
    }
  }
  return 1;
}

Assistant:

static int
resolve_hash_table_find_equal(void *val1_p, void *val2_p, int mod, void *UNUSED(cb_data))
{
    struct lyd_node *val2, *elem2;
    struct parsed_pred pp;
    const char *str;
    int i;

    assert(!mod);
    (void)mod;

    pp = *((struct parsed_pred *)val1_p);
    val2 = *((struct lyd_node **)val2_p);

    if (val2->schema != pp.schema) {
        return 0;
    }

    switch (val2->schema->nodetype) {
    case LYS_CONTAINER:
    case LYS_LEAF:
    case LYS_ANYXML:
    case LYS_ANYDATA:
        return 1;
    case LYS_LEAFLIST:
        str = ((struct lyd_node_leaf_list *)val2)->value_str;
        if (!strncmp(str, pp.pred[0].value, pp.pred[0].val_len) && !str[pp.pred[0].val_len]) {
            return 1;
        }
        return 0;
    case LYS_LIST:
        assert(((struct lys_node_list *)val2->schema)->keys_size);
        assert(((struct lys_node_list *)val2->schema)->keys_size == pp.len);

        /* lists with keys, their equivalence is based on their keys */
        elem2 = val2->child;
        /* the exact data order is guaranteed */
        for (i = 0; elem2 && (i < pp.len); ++i) {
            /* module check */
            if (pp.pred[i].mod_name) {
                if (strncmp(lyd_node_module(elem2)->name, pp.pred[i].mod_name, pp.pred[i].mod_name_len)
                        || lyd_node_module(elem2)->name[pp.pred[i].mod_name_len]) {
                    break;
                }
            } else {
                if (lyd_node_module(elem2) != lys_node_module(pp.schema)) {
                    break;
                }
            }

            /* name check */
            if (strncmp(elem2->schema->name, pp.pred[i].name, pp.pred[i].nam_len) || elem2->schema->name[pp.pred[i].nam_len]) {
                break;
            }

            /* value check */
            str = ((struct lyd_node_leaf_list *)elem2)->value_str;
            if (strncmp(str, pp.pred[i].value, pp.pred[i].val_len) || str[pp.pred[i].val_len]) {
                break;
            }

            /* next key */
            elem2 = elem2->next;
        }
        if (i == pp.len) {
            return 1;
        }
        return 0;
    default:
        break;
    }

    LOGINT(val2->schema->module->ctx);
    return 0;
}